

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_ldm_blockCompress
                 (rawSeqStore_t *rawSeqStore,ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_paramSwitch_e useRowMatchFinder,void *src,size_t srcSize)

{
  BYTE *pBVar1;
  rawSeq *prVar2;
  BYTE *pBVar3;
  U32 minMatch;
  BYTE *pBVar4;
  seqDef *psVar5;
  undefined8 uVar6;
  ZSTD_blockCompressor UNRECOVERED_JUMPTABLE;
  size_t sVar7;
  ZSTD_dictMode_e dictMode;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  BYTE *ip;
  long lVar11;
  BYTE *end;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  
  dictMode = ZSTD_extDict;
  if ((ms->window).dictLimit <= (ms->window).lowLimit) {
    if (ms->dictMatchState == (ZSTD_matchState_t *)0x0) {
      dictMode = ZSTD_noDict;
    }
    else {
      dictMode = ZSTD_dedicatedDictSearch - (ms->dictMatchState->dedicatedDictSearch == 0);
    }
  }
  minMatch = (ms->cParams).minMatch;
  UNRECOVERED_JUMPTABLE =
       ZSTD_selectBlockCompressor((ms->cParams).strategy,useRowMatchFinder,dictMode);
  if (ZSTD_btlazy2 < (ms->cParams).strategy) {
    ms->ldmSeqStore = rawSeqStore;
    sVar7 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,srcSize);
    ZSTD_ldm_skipRawSeqStoreBytes(rawSeqStore,srcSize);
    return sVar7;
  }
  uVar12 = rawSeqStore->pos;
  uVar13 = rawSeqStore->size;
  if (uVar13 < uVar12) {
    __assert_fail("rawSeqStore->pos <= rawSeqStore->size",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7efb,
                  "size_t ZSTD_ldm_blockCompress(rawSeqStore_t *, ZSTD_matchState_t *, seqStore_t *, U32 *, ZSTD_paramSwitch_e, const void *, size_t)"
                 );
  }
  if (rawSeqStore->capacity < uVar13) {
    __assert_fail("rawSeqStore->size <= rawSeqStore->capacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7efc,
                  "size_t ZSTD_ldm_blockCompress(rawSeqStore_t *, ZSTD_matchState_t *, seqStore_t *, U32 *, ZSTD_paramSwitch_e, const void *, size_t)"
                 );
  }
  pBVar1 = (BYTE *)((long)src + srcSize);
  if (0 < (long)srcSize && uVar12 < uVar13) {
    end = (BYTE *)src;
    do {
      prVar2 = rawSeqStore->seq + uVar12;
      uVar13._0_4_ = prVar2->offset;
      uVar13._4_4_ = prVar2->litLength;
      if ((undefined4)uVar13 == 0) {
        __assert_fail("sequence.offset > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x7ebd,"rawSeq maybeSplitSequence(rawSeqStore_t *, const U32, const U32)");
      }
      uVar10 = uVar13 >> 0x20;
      uVar14 = rawSeqStore->seq[uVar12].matchLength;
      uVar9 = (uint)((long)pBVar1 - (long)end);
      if (uVar9 < uVar14 + uVar13._4_4_) {
        ZSTD_ldm_skipSequences(rawSeqStore,(long)pBVar1 - (long)end & 0xffffffff,minMatch);
        uVar12 = uVar13 & 0xffffffff;
        if (uVar9 - uVar13._4_4_ < minMatch) {
          uVar12 = 0;
        }
        uVar14 = uVar9 - uVar13._4_4_;
        src = end;
        if ((uVar9 < (uint)uVar13._4_4_ || uVar14 == 0) || (uVar13 = uVar12, uVar14 < minMatch))
        break;
      }
      else {
        rawSeqStore->pos = uVar12 + 1;
      }
      pBVar3 = end + uVar10;
      src = pBVar3 + uVar14;
      if (pBVar1 < src) {
        __assert_fail("ip + sequence.litLength + sequence.matchLength <= iend",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x7f07,
                      "size_t ZSTD_ldm_blockCompress(rawSeqStore_t *, ZSTD_matchState_t *, seqStore_t *, U32 *, ZSTD_paramSwitch_e, const void *, size_t)"
                     );
      }
      uVar9 = (int)end - *(int *)&(ms->window).base;
      if (ms->nextToUpdate + 0x400 < uVar9) {
        uVar8 = (uVar9 - ms->nextToUpdate) - 0x400;
        if (0x1ff < uVar8) {
          uVar8 = 0x200;
        }
        ms->nextToUpdate = uVar9 - uVar8;
      }
      ZSTD_ldm_fillFastTables(ms,end);
      sVar7 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,end,uVar10);
      *(undefined8 *)(rep + 1) = *(undefined8 *)rep;
      *rep = (U32)uVar13;
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
        __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468b,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0x20000 < seqStore->maxNbLit) {
        __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468d,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      pBVar4 = seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < pBVar4 + sVar7) {
        __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468e,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (pBVar1 < pBVar3) {
        __assert_fail("literals + litLength <= litLimit",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468f,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      ip = pBVar3 + -sVar7;
      if (pBVar1 + -0x20 < pBVar3) {
        ZSTD_safecopyLiterals(pBVar4,ip,pBVar3,pBVar1 + -0x20);
LAB_00172d4c:
        seqStore->lit = seqStore->lit + sVar7;
        if (0xffff < sVar7) {
          if (seqStore->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46a0,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
      }
      else {
        uVar6 = *(undefined8 *)(ip + 8);
        *(undefined8 *)pBVar4 = *(undefined8 *)ip;
        *(undefined8 *)(pBVar4 + 8) = uVar6;
        pBVar3 = seqStore->lit;
        if (0x10 < sVar7) {
          if ((BYTE *)0xffffffffffffffe0 < pBVar3 + 0x10 + (-0x10 - (long)(ip + 0x10))) {
            __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x36a6,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          uVar6 = *(undefined8 *)(ip + 0x18);
          *(undefined8 *)(pBVar3 + 0x10) = *(undefined8 *)(ip + 0x10);
          *(undefined8 *)(pBVar3 + 0x18) = uVar6;
          if (0x20 < (long)sVar7) {
            lVar11 = 0;
            do {
              uVar6 = *(undefined8 *)(end + lVar11 + (uVar10 - sVar7) + 0x20 + 8);
              pBVar4 = pBVar3 + lVar11 + 0x20;
              *(undefined8 *)pBVar4 = *(undefined8 *)(end + lVar11 + (uVar10 - sVar7) + 0x20);
              *(undefined8 *)(pBVar4 + 8) = uVar6;
              uVar6 = *(undefined8 *)(end + lVar11 + (uVar10 - sVar7) + 0x30 + 8);
              *(undefined8 *)(pBVar4 + 0x10) =
                   *(undefined8 *)(end + lVar11 + (uVar10 - sVar7) + 0x30);
              *(undefined8 *)(pBVar4 + 0x18) = uVar6;
              lVar11 = lVar11 + 0x20;
            } while (pBVar4 + 0x20 < pBVar3 + sVar7);
          }
          goto LAB_00172d4c;
        }
        seqStore->lit = pBVar3 + sVar7;
      }
      psVar5 = seqStore->sequences;
      psVar5->litLength = (U16)sVar7;
      psVar5->offBase = (U32)uVar13 + 3;
      if (uVar14 < 3) {
        __assert_fail("matchLength >= MINMATCH",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x46aa,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      uVar12 = (ulong)uVar14 - 3;
      if (0xffff < uVar12) {
        if (seqStore->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46ad,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos = (U32)((ulong)((long)psVar5 - (long)seqStore->sequencesStart) >> 3)
        ;
      }
      psVar5->mlBase = (U16)uVar12;
      seqStore->sequences = psVar5 + 1;
      uVar12 = rawSeqStore->pos;
      if ((rawSeqStore->size <= uVar12) || (end = (BYTE *)src, pBVar1 <= src)) break;
    } while( true );
  }
  uVar14 = (int)src - *(int *)&(ms->window).base;
  if (ms->nextToUpdate + 0x400 < uVar14) {
    uVar9 = (uVar14 - ms->nextToUpdate) - 0x400;
    if (0x1ff < uVar9) {
      uVar9 = 0x200;
    }
    ms->nextToUpdate = uVar14 - uVar9;
  }
  ZSTD_ldm_fillFastTables(ms,src);
  sVar7 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,(long)pBVar1 - (long)src);
  return sVar7;
}

Assistant:

size_t ZSTD_ldm_blockCompress(rawSeqStore_t* rawSeqStore,
    ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
    ZSTD_paramSwitch_e useRowMatchFinder,
    void const* src, size_t srcSize)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    unsigned const minMatch = cParams->minMatch;
    ZSTD_blockCompressor const blockCompressor =
        ZSTD_selectBlockCompressor(cParams->strategy, useRowMatchFinder, ZSTD_matchState_dictMode(ms));
    /* Input bounds */
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    /* Input positions */
    BYTE const* ip = istart;

    DEBUGLOG(5, "ZSTD_ldm_blockCompress: srcSize=%zu", srcSize);
    /* If using opt parser, use LDMs only as candidates rather than always accepting them */
    if (cParams->strategy >= ZSTD_btopt) {
        size_t lastLLSize;
        ms->ldmSeqStore = rawSeqStore;
        lastLLSize = blockCompressor(ms, seqStore, rep, src, srcSize);
        ZSTD_ldm_skipRawSeqStoreBytes(rawSeqStore, srcSize);
        return lastLLSize;
    }

    assert(rawSeqStore->pos <= rawSeqStore->size);
    assert(rawSeqStore->size <= rawSeqStore->capacity);
    /* Loop through each sequence and apply the block compressor to the literals */
    while (rawSeqStore->pos < rawSeqStore->size && ip < iend) {
        /* maybeSplitSequence updates rawSeqStore->pos */
        rawSeq const sequence = maybeSplitSequence(rawSeqStore,
                                                   (U32)(iend - ip), minMatch);
        int i;
        /* End signal */
        if (sequence.offset == 0)
            break;

        assert(ip + sequence.litLength + sequence.matchLength <= iend);

        /* Fill tables for block compressor */
        ZSTD_ldm_limitTableUpdate(ms, ip);
        ZSTD_ldm_fillFastTables(ms, ip);
        /* Run the block compressor */
        DEBUGLOG(5, "pos %u : calling block compressor on segment of size %u", (unsigned)(ip-istart), sequence.litLength);
        {
            size_t const newLitLength =
                blockCompressor(ms, seqStore, rep, ip, sequence.litLength);
            ip += sequence.litLength;
            /* Update the repcodes */
            for (i = ZSTD_REP_NUM - 1; i > 0; i--)
                rep[i] = rep[i-1];
            rep[0] = sequence.offset;
            /* Store the sequence */
            ZSTD_storeSeq(seqStore, newLitLength, ip - newLitLength, iend,
                          OFFSET_TO_OFFBASE(sequence.offset),
                          sequence.matchLength);
            ip += sequence.matchLength;
        }
    }
    /* Fill the tables for the block compressor */
    ZSTD_ldm_limitTableUpdate(ms, ip);
    ZSTD_ldm_fillFastTables(ms, ip);
    /* Compress the last literals */
    return blockCompressor(ms, seqStore, rep, ip, iend - ip);
}